

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *poVar2;
  pointer pSVar3;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  
  if ((this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    printOpenHeader(this,&((this->super_StreamingReporterBase).currentTestCaseInfo.
                           super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    pSVar3 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0x68)) {
      lineInfo.file._M_dataplus._M_p._0_1_ = 0;
      Colour::use(Headers);
      pSVar3 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
        printHeaderString(this,&pSVar3->name,2);
      }
      Colour::~Colour((Colour *)&lineInfo);
      pSVar3 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    SourceLineInfo::SourceLineInfo(&lineInfo,&pSVar3->lineInfo);
    if (lineInfo.file._M_string_length != 0) {
      if (getLineOfChars<(char)45>()::line == '\0') {
        uRam0000000000146640 = 0x2d2d2d2d2d2d2d;
        uRam0000000000146647 = 0x2d2d2d2d2d2d2d2d;
        _DAT_00146630 = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000146638 = 0x2d2d2d2d2d2d2d;
        DAT_0014663f = 0x2d;
        _DAT_00146620 = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000146628 = 0x2d2d2d2d2d2d2d2d;
        _DAT_00146610 = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000146618 = 0x2d2d2d2d2d2d2d2d;
        _line = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000146608 = 0x2d2d2d2d2d2d2d2d;
        DAT_0014664f = 0;
      }
      poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                               &getLineOfChars<(char)45>()::line);
      std::operator<<(poVar2,"\n");
      colourGuard_1.m_moved = false;
      Colour::use(FileName);
      poVar2 = (this->super_StreamingReporterBase).stream;
      operator<<(poVar2,&lineInfo);
      std::operator<<(poVar2,"\n");
      Colour::~Colour(&colourGuard_1);
    }
    if (getLineOfChars<(char)46>()::line == '\0') {
      uRam0000000000146690 = 0x2e2e2e2e2e2e2e;
      uRam0000000000146697 = 0x2e2e2e2e2e2e2e2e;
      _DAT_00146680 = 0x2e2e2e2e2e2e2e2e;
      uRam0000000000146688 = 0x2e2e2e2e2e2e2e;
      DAT_0014668f = 0x2e;
      _DAT_00146670 = 0x2e2e2e2e2e2e2e2e;
      uRam0000000000146678 = 0x2e2e2e2e2e2e2e2e;
      _DAT_00146660 = 0x2e2e2e2e2e2e2e2e;
      uRam0000000000146668 = 0x2e2e2e2e2e2e2e2e;
      _line = 0x2e2e2e2e2e2e2e2e;
      uRam0000000000146658 = 0x2e2e2e2e2e2e2e2e;
      DAT_0014669f = 0;
    }
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                             &getLineOfChars<(char)46>()::line);
    poVar2 = std::operator<<(poVar2,"\n");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&lineInfo);
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kasperisager[P]hemingway/vendor/catch.hpp"
                ,0x2605,"void Catch::ConsoleReporter::printTestCaseAndSectionHeader()");
}

Assistant:

Generic::AnyOf<ExpressionT> Matcher<ExpressionT>::operator || ( Matcher<ExpressionT> const& other ) const {
        Generic::AnyOf<ExpressionT> anyOfExpr;
        anyOfExpr.add( *this );
        anyOfExpr.add( other );
        return anyOfExpr;
    }